

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_ObjSuppSize_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  iVar3 = 0;
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
    if (uVar2 == 2) {
      iVar3 = 1;
    }
    else {
      if ((uVar2 != 7) && (uVar2 != 10 && (*(uint *)&pObj->field_0x14 & 0xe) != 8)) {
        __assert_fail("Abc_ObjIsNode(pObj) || Abc_ObjIsBox(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcDfs.c"
                      ,0x438,"int Abc_ObjSuppSize_rec(Abc_Obj_t *)");
      }
      iVar3 = 0;
      for (lVar4 = 0; lVar4 < (pObj->vFanins).nSize; lVar4 = lVar4 + 1) {
        iVar1 = Abc_ObjSuppSize_rec((Abc_Obj_t *)
                                    pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]]);
        iVar3 = iVar3 + iVar1;
      }
    }
  }
  return iVar3;
}

Assistant:

int Abc_ObjSuppSize_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i, Counter = 0;
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 0;
    Abc_NodeSetTravIdCurrent(pObj);
    if ( Abc_ObjIsPi(pObj) )
        return 1;
    assert( Abc_ObjIsNode(pObj) || Abc_ObjIsBox(pObj) );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Counter += Abc_ObjSuppSize_rec( pFanin );
    return Counter;
}